

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  wasm_frame_t *frame;
  int iVar8;
  char *pcVar9;
  size_t i_1;
  wasm_valtype_t *pwVar10;
  int i;
  ulong uVar11;
  wasm_valtype_t *rs [1];
  long local_70;
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_name_t message;
  wasm_extern_t *imports [1];
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("trap.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar3);
    sVar3 = fread(binary.data,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,&binary);
      if (lVar4 == 0) {
        pcVar9 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(&binary);
        puts("Creating callback...");
        rs[0] = (wasm_valtype_t *)wasm_valtype_new(0);
        wasm_valtype_vec_new_empty(&exports);
        wasm_valtype_vec_new(&message,1,rs);
        uVar5 = wasm_functype_new(&exports,&message);
        uVar6 = wasm_func_new_with_env(uVar2,uVar5,fail_callback,uVar2,0);
        wasm_functype_delete(uVar5);
        puts("Instantiating module...");
        imports[0] = (wasm_extern_t *)wasm_func_as_extern(uVar6);
        lVar7 = wasm_instance_new(uVar2,lVar4,imports,0);
        if (lVar7 != 0) {
          wasm_func_delete(uVar6);
          puts("Extracting exports...");
          wasm_instance_exports(lVar7,&exports);
          iVar8 = 1;
          if (exports.size < 2) {
            pcVar9 = "> Error accessing exports!";
          }
          else {
            wasm_module_delete(lVar4);
            wasm_instance_delete(lVar7);
            for (uVar11 = 0; uVar11 != 2; uVar11 = uVar11 + 1) {
              lVar4 = wasm_extern_as_func(exports.data[uVar11]);
              if (lVar4 == 0) {
                pcVar9 = "> Error accessing export!";
                goto LAB_001027d4;
              }
              printf("Calling export %d...\n",uVar11 & 0xffffffff);
              lVar4 = wasm_func_call(lVar4,0,0);
              if (lVar4 == 0) {
                pcVar9 = "> Error calling function, expected trap!";
                goto LAB_001027d4;
              }
              puts("Printing message...");
              wasm_trap_message(lVar4,&message);
              printf("> %s\n",message.data);
              puts("Printing origin...");
              frame = (wasm_frame_t *)wasm_trap_origin(lVar4);
              if (frame == (wasm_frame_t *)0x0) {
                puts("> Empty origin.");
              }
              else {
                print_frame(frame);
                wasm_frame_delete(frame);
              }
              puts("Printing trace...");
              wasm_trap_trace(lVar4,rs);
              if (rs[0] == (wasm_valtype_t *)0x0) {
                puts("> Empty trace.");
              }
              else {
                for (pwVar10 = (wasm_valtype_t *)0x0; pwVar10 < rs[0]; pwVar10 = pwVar10 + 1) {
                  print_frame(*(wasm_frame_t **)(local_70 + (long)pwVar10 * 8));
                }
              }
              wasm_frame_vec_delete(rs);
              wasm_trap_delete(lVar4);
              wasm_byte_vec_delete(&message);
            }
            wasm_extern_vec_delete(&exports);
            puts("Shutting down...");
            wasm_store_delete(uVar2);
            wasm_engine_delete(uVar1);
            iVar8 = 0;
            pcVar9 = "Done.";
          }
LAB_001027d4:
          puts(pcVar9);
          return iVar8;
        }
        pcVar9 = "> Error instantiating module!";
      }
      goto LAB_00102626;
    }
  }
  pcVar9 = "> Error loading module!";
LAB_00102626:
  puts(pcVar9);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("trap.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* fail_type =
    wasm_functype_new_0_1(wasm_valtype_new_i32());
  own wasm_func_t* fail_func =
    wasm_func_new_with_env(store, fail_type, fail_callback, store, NULL);

  wasm_functype_delete(fail_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = { wasm_func_as_extern(fail_func) };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(fail_func);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size < 2) {
    printf("> Error accessing exports!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  for (int i = 0; i < 2; ++i) {
    const wasm_func_t* func = wasm_extern_as_func(exports.data[i]);
    if (func == NULL) {
      printf("> Error accessing export!\n");
      return 1;
    }

    printf("Calling export %d...\n", i);
    own wasm_trap_t* trap = wasm_func_call(func, NULL, NULL);
    if (!trap) {
      printf("> Error calling function, expected trap!\n");
      return 1;
    }

    printf("Printing message...\n");
    own wasm_name_t message;
    wasm_trap_message(trap, &message);
    printf("> %s\n", message.data);

    printf("Printing origin...\n");
    own wasm_frame_t* frame = wasm_trap_origin(trap);
    if (frame) {
      print_frame(frame);
      wasm_frame_delete(frame);
    } else {
      printf("> Empty origin.\n");
    }

    printf("Printing trace...\n");
    own wasm_frame_vec_t trace;
    wasm_trap_trace(trap, &trace);
    if (trace.size > 0) {
      for (size_t i = 0; i < trace.size; ++i) {
        print_frame(trace.data[i]);
      }
    } else {
      printf("> Empty trace.\n");
    }

    wasm_frame_vec_delete(&trace);
    wasm_trap_delete(trap);
    wasm_name_delete(&message);
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}